

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

VoidPromiseAndPipeline * __thiscall
capnp::LocalCallContext::directTailCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalCallContext *this,
          Own<capnp::RequestHook> *request)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>
  *pTVar4;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>
  *extraout_RDX;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>
  *extraout_RDX_00;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>_>
  OVar5;
  RemotePromise<capnp::AnyPointer> promise;
  Fault local_70;
  long *local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  long local_50;
  undefined8 uStack_48;
  undefined8 *local_40;
  Own<kj::_::PromiseNode> local_38;
  LocalCallContext *local_20;
  
  if ((this->response).ptr.isSet != true) {
    (**request->ptr->_vptr_RequestHook)(&local_70);
    local_20 = this;
    OVar5 = kj::
            heap<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::AnyPointer>,capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
                      (&local_38,(anon_class_8_1_8991fb9c_for_func *)&local_70,
                       (PropagateException *)&local_20);
    uVar3 = uStack_48;
    lVar2 = local_50;
    pTVar4 = OVar5.ptr;
    (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = local_38.disposer;
    (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_38.ptr;
    *(undefined4 *)&(__return_storage_ptr__->pipeline).disposer = local_60;
    *(undefined4 *)((long)&(__return_storage_ptr__->pipeline).disposer + 4) = uStack_5c;
    *(undefined4 *)&(__return_storage_ptr__->pipeline).ptr = (undefined4)uStack_58;
    *(undefined4 *)((long)&(__return_storage_ptr__->pipeline).ptr + 4) = uStack_58._4_4_;
    uStack_58 = (long *)0x0;
    if (local_50 != 0) {
      local_50 = 0;
      uStack_48 = 0;
      (**(code **)*local_40)(local_40,lVar2,8,uVar3,uVar3,0);
      plVar1 = uStack_58;
      pTVar4 = extraout_RDX;
      if (uStack_58 != (long *)0x0) {
        uStack_58 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_5c,local_60))
                  ((undefined8 *)CONCAT44(uStack_5c,local_60),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
        pTVar4 = extraout_RDX_00;
      }
    }
    plVar1 = local_68;
    if (local_68 != (long *)0x0) {
      local_68 = (long *)0x0;
      (**(code **)((local_70.exception)->ownFile).content.ptr)
                (local_70.exception,(long)plVar1 + *(long *)(*plVar1 + -0x10),pTVar4);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
            (&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x98,FAILED,"response == nullptr",
             "\"Can\'t call tailCall() after initializing the results struct.\"",
             (char (*) [61])"Can\'t call tailCall() after initializing the results struct.");
  kj::_::Debug::Fault::fatal(&local_70);
}

Assistant:

ClientHook::VoidPromiseAndPipeline directTailCall(kj::Own<RequestHook>&& request) override {
    KJ_REQUIRE(response == nullptr, "Can't call tailCall() after initializing the results struct.");

    auto promise = request->send();

    auto voidPromise = promise.then([this](Response<AnyPointer>&& tailResponse) {
      response = kj::mv(tailResponse);
    });

    return { kj::mv(voidPromise), PipelineHook::from(kj::mv(promise)) };
  }